

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O0

size_t __thiscall ON_FixedSizePool::BlockElementCount(ON_FixedSizePool *this,void *block)

{
  void *local_40;
  char *block_head;
  char *block_end;
  void *block_local;
  ON_FixedSizePool *this_local;
  
  if ((block == (void *)0x0) || (this->m_sizeof_element == 0)) {
    this_local = (ON_FixedSizePool *)0x0;
  }
  else {
    if ((block == this->m_al_block) && (this->m_al_count != 0)) {
      local_40 = this->m_al_element_array;
    }
    else {
      local_40 = *(void **)((long)block + 8);
    }
    this_local = (ON_FixedSizePool *)
                 ((ulong)((long)local_40 - ((long)block + 0x10)) / this->m_sizeof_element);
  }
  return (size_t)this_local;
}

Assistant:

size_t ON_FixedSizePool::BlockElementCount( const void* block ) const
{
  // returns number of items currently allocated from block
  if ( 0 == block || m_sizeof_element <= 0 )
    return 0;

  const char* block_end
    = (block == m_al_block && m_al_count > 0)
    ? ((const char*)m_al_element_array)
    : *((const char**)(((const char*)block)+sizeof(void*)));

  const char* block_head = (((const char*)block) + 2*sizeof(void*));

  return (block_end - block_head)/m_sizeof_element;
}